

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O1

size_t __thiscall
lossless_neural_sound::expression_compiler::expression::Expression_node::get_tree_index
          (Expression_node *this)

{
  Expression_node *pEVar1;
  Expression_node *pEVar2;
  bool bVar3;
  long lVar4;
  size_t sVar5;
  AA_tree_node *this_00;
  
  pEVar1 = (this->aa_tree_node).left_child;
  if (pEVar1 == (Expression_node *)0x0) {
    sVar5 = 0;
  }
  else {
    sVar5 = (pEVar1->aa_tree_node).tree_size;
  }
  if ((this->aa_tree_node).parent != (Expression_node *)0x0) {
    this_00 = &this->aa_tree_node;
    do {
      bVar3 = AA_tree_node::is_valid(this_00);
      if (!bVar3) {
        __assert_fail("node->aa_tree_node.is_valid()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/programmerjake[P]lossless_neural_sound/src/expression_compiler/expression.h"
                      ,0xf1,
                      "std::size_t lossless_neural_sound::expression_compiler::expression::Expression_node::get_tree_index() const"
                     );
      }
      pEVar1 = this_00->parent;
      if (this == (pEVar1->aa_tree_node).right_child) {
        pEVar2 = (pEVar1->aa_tree_node).left_child;
        if (pEVar2 == (Expression_node *)0x0) {
          lVar4 = 1;
        }
        else {
          lVar4 = (pEVar2->aa_tree_node).tree_size + 1;
        }
        sVar5 = sVar5 + lVar4;
      }
      this_00 = &pEVar1->aa_tree_node;
      this = pEVar1;
    } while ((pEVar1->aa_tree_node).parent != (Expression_node *)0x0);
  }
  return sVar5;
}

Assistant:

std::size_t get_tree_index() const noexcept
    {
        std::size_t retval = get_tree_size(aa_tree_node.left_child);
        const Expression_node *node = this;
        while(node->aa_tree_node.parent)
        {
            assert(node->aa_tree_node.is_valid());
            auto *parent = node->aa_tree_node.parent;
            if(node == parent->aa_tree_node.right_child)
                retval += 1 + get_tree_size(parent->aa_tree_node.left_child);
            node = parent;
        }
        return retval;
    }